

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void parse_line_service(parse_state *state,int nargs,char **args)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  listnode *item;
  undefined8 *puVar6;
  ulong uVar7;
  undefined8 *in_RDX;
  int in_ESI;
  parse_state *in_RDI;
  char *pcVar8;
  socketinfo *si;
  svcenvinfo *ei;
  int n;
  int kw_nargs;
  int kw;
  int i;
  command *cmd;
  service *svc;
  char *in_stack_ffffffffffffffa8;
  int local_38;
  int local_2c;
  
  pvVar1 = in_RDI->context;
  if (in_ESI != 0) {
    iVar2 = lookup_keyword(in_stack_ffffffffffffffa8);
    switch(iVar2) {
    case 1:
      break;
    default:
      parse_error(in_RDI,"invalid option \'%s\'\n",*in_RDX);
      break;
    case 4:
      if (in_ESI == 2) {
        *(undefined8 *)((long)pvVar1 + 0x18) = in_RDX[1];
      }
      else {
        parse_error(in_RDI,"class option requires a classname\n");
      }
      break;
    case 7:
      *(uint *)((long)pvVar1 + 0x20) = *(uint *)((long)pvVar1 + 0x20) | 0x10;
      break;
    case 8:
      *(uint *)((long)pvVar1 + 0x20) = *(uint *)((long)pvVar1 + 0x20) | 0x20;
      break;
    case 9:
      *(uint *)((long)pvVar1 + 0x20) = *(uint *)((long)pvVar1 + 0x20) | 1;
      break;
    case 0xd:
      if (in_ESI < 2) {
        parse_error(in_RDI,"group option requires a group id\n");
      }
      else if (in_ESI < 9) {
        uVar4 = decode_uid(in_stack_ffffffffffffffa8);
        *(uint *)((long)pvVar1 + 0x40) = uVar4;
        for (local_38 = 2; local_38 < in_ESI; local_38 = local_38 + 1) {
          uVar4 = decode_uid(in_stack_ffffffffffffffa8);
          *(uint *)((long)pvVar1 + (long)(local_38 + -2) * 4 + 0x44) = uVar4;
        }
        *(long *)((long)pvVar1 + 0x60) = (long)(local_38 + -2);
      }
      else {
        parse_error(in_RDI,"group option accepts at most %d supp. groups\n",6);
      }
      break;
    case 0x12:
      if (in_ESI < 2) {
        parse_error(in_RDI,"keycodes option requires atleast one keycode\n");
      }
      else {
        pvVar5 = malloc((long)(in_ESI + -1) << 2);
        *(void **)((long)pvVar1 + 0xd0) = pvVar5;
        if (*(long *)((long)pvVar1 + 0xd0) == 0) {
          parse_error(in_RDI,"could not allocate keycodes\n");
        }
        else {
          *(int *)((long)pvVar1 + 0xd8) = in_ESI + -1;
          for (local_2c = 1; local_2c < in_ESI; local_2c = local_2c + 1) {
            iVar2 = atoi((char *)in_RDX[local_2c]);
            *(int *)(*(long *)((long)pvVar1 + 0xd0) + (long)(local_2c + -1) * 4) = iVar2;
          }
        }
      }
      break;
    case 0x16:
      *(uint *)((long)pvVar1 + 0x20) = *(uint *)((long)pvVar1 + 0x20) | 2;
      break;
    case 0x17:
      iVar2 = in_ESI + -1;
      puVar6 = in_RDX + 1;
      iVar3 = lookup_keyword(in_stack_ffffffffffffffa8);
      if ((keyword_info[iVar3].flags & 2) == 0) {
        parse_error(in_RDI,"invalid command \'%s\'\n",*puVar6);
      }
      else {
        uVar4 = (uint)keyword_info[iVar3].nargs;
        if (iVar2 < (int)uVar4) {
          pcVar8 = "argument";
          if (2 < uVar4) {
            pcVar8 = "arguments";
          }
          parse_error(in_RDI,"%s requires %d %s\n",*puVar6,(ulong)(uVar4 - 1),pcVar8);
        }
        else {
          item = (listnode *)malloc((long)iVar2 * 8 + 0x28);
          item[1].next = (listnode *)keyword_info[iVar3].func;
          *(int *)&item[1].prev = iVar2;
          memcpy(item + 2,puVar6,(long)iVar2 << 3);
          list_add_tail((listnode *)((long)pvVar1 + 0xb8),item);
        }
      }
      break;
    case 0x1a:
      if (in_ESI < 2) {
        parse_error(in_RDI,"setenv option requires name and value arguments\n");
      }
      else {
        puVar6 = (undefined8 *)calloc(1,0x18);
        if (puVar6 == (undefined8 *)0x0) {
          parse_error(in_RDI,"out of memory\n");
        }
        else {
          puVar6[1] = in_RDX[1];
          puVar6[2] = in_RDX[2];
          *puVar6 = *(undefined8 *)((long)pvVar1 + 0x70);
          *(undefined8 **)((long)pvVar1 + 0x70) = puVar6;
        }
      }
      break;
    case 0x1d:
      if (in_ESI < 4) {
        parse_error(in_RDI,"socket option requires name, type, perm arguments\n");
      }
      else {
        iVar2 = strcmp((char *)in_RDX[2],"dgram");
        if ((iVar2 == 0) || (iVar2 = strcmp((char *)in_RDX[2],"stream"), iVar2 == 0)) {
          puVar6 = (undefined8 *)calloc(1,0x28);
          if (puVar6 == (undefined8 *)0x0) {
            parse_error(in_RDI,"out of memory\n");
          }
          else {
            puVar6[1] = in_RDX[1];
            puVar6[2] = in_RDX[2];
            uVar7 = strtoul((char *)in_RDX[3],(char **)0x0,8);
            *(int *)(puVar6 + 4) = (int)uVar7;
            if (4 < in_ESI) {
              uVar4 = decode_uid(in_stack_ffffffffffffffa8);
              *(uint *)(puVar6 + 3) = uVar4;
            }
            if (5 < in_ESI) {
              uVar4 = decode_uid(in_stack_ffffffffffffffa8);
              *(uint *)((long)puVar6 + 0x1c) = uVar4;
            }
            *puVar6 = *(undefined8 *)((long)pvVar1 + 0x68);
            *(undefined8 **)((long)pvVar1 + 0x68) = puVar6;
          }
        }
        else {
          parse_error(in_RDI,"socket type must be \'dgram\' or \'stream\'\n");
        }
      }
      break;
    case 0x23:
      if (in_ESI == 2) {
        uVar4 = decode_uid(in_stack_ffffffffffffffa8);
        *(uint *)((long)pvVar1 + 0x3c) = uVar4;
      }
      else {
        parse_error(in_RDI,"user option requires a user id\n");
      }
    }
  }
  return;
}

Assistant:

static void parse_line_service(struct parse_state *state, int nargs, char **args)
{
    struct service *svc = state->context;
    struct command *cmd;
    int i, kw, kw_nargs;

    if (nargs == 0) {
        return;
    }
    
    kw = lookup_keyword(args[0]);
    switch (kw) {
    case K_capability:
        break;
    case K_class:
        if (nargs != 2) {
            parse_error(state, "class option requires a classname\n");
        } else {
            svc->classname = args[1];
        }
        break;
    case K_console:
        svc->flags |= SVC_CONSOLE;
        break;
    case K_disabled:
        svc->flags |= SVC_DISABLED;
        break;
    case K_group:
        if (nargs < 2) {
            parse_error(state, "group option requires a group id\n");
        } else if (nargs > NR_SVC_SUPP_GIDS + 2) {
            parse_error(state, "group option accepts at most %d supp. groups\n",
                        NR_SVC_SUPP_GIDS);
        } else {
            int n;
            svc->gid = decode_uid(args[1]);
            for (n = 2; n < nargs; n++) {
                svc->supp_gids[n-2] = decode_uid(args[n]);
            }
            svc->nr_supp_gids = n - 2;
        }
        break;
    case K_keycodes:
        if (nargs < 2) {
            parse_error(state, "keycodes option requires atleast one keycode\n");
        } else {
            svc->keycodes = malloc((nargs - 1) * sizeof(svc->keycodes[0]));
            if (!svc->keycodes) {
                parse_error(state, "could not allocate keycodes\n");
            } else {
                svc->nkeycodes = nargs - 1;
                for (i = 1; i < nargs; i++) {
                    svc->keycodes[i - 1] = atoi(args[i]);
                }
            }
        }
        break;
    case K_oneshot:
        svc->flags |= SVC_ONESHOT;
        break;
    case K_onrestart:
        nargs--;
        args++;
        kw = lookup_keyword(args[0]);
        if (!kw_is(kw, COMMAND)) {
            parse_error(state, "invalid command '%s'\n", args[0]);
            break;
        }
        kw_nargs = kw_nargs(kw);
        if (nargs < kw_nargs) {
            parse_error(state, "%s requires %d %s\n", args[0], kw_nargs - 1,
                kw_nargs > 2 ? "arguments" : "argument");
            break;
        }

        cmd = malloc(sizeof(*cmd) + sizeof(char*) * nargs);
        cmd->func = kw_func(kw);
        cmd->nargs = nargs;
        memcpy(cmd->args, args, sizeof(char*) * nargs);
        list_add_tail(&svc->onrestart.commands, &cmd->clist);
        break;
    case K_critical:
        svc->flags |= SVC_CRITICAL;
        break;
    case K_setenv: { /* name value */
        struct svcenvinfo *ei;
        if (nargs < 2) {
            parse_error(state, "setenv option requires name and value arguments\n");
            break;
        }
        ei = calloc(1, sizeof(*ei));
        if (!ei) {
            parse_error(state, "out of memory\n");
            break;
        }
        ei->name = args[1];
        ei->value = args[2];
        ei->next = svc->envvars;
        svc->envvars = ei;
        break;
    }
    case K_socket: {/* name type perm [ uid gid ] */
        struct socketinfo *si;
        if (nargs < 4) {
            parse_error(state, "socket option requires name, type, perm arguments\n");
            break;
        }
        if (strcmp(args[2],"dgram") && strcmp(args[2],"stream")) {
            parse_error(state, "socket type must be 'dgram' or 'stream'\n");
            break;
        }
        si = calloc(1, sizeof(*si));
        if (!si) {
            parse_error(state, "out of memory\n");
            break;
        }
        si->name = args[1];
        si->type = args[2];
        si->perm = strtoul(args[3], 0, 8);
        if (nargs > 4)
            si->uid = decode_uid(args[4]);
        if (nargs > 5)
            si->gid = decode_uid(args[5]);
        si->next = svc->sockets;
        svc->sockets = si;
        break;
    }
    case K_user:
        if (nargs != 2) {
            parse_error(state, "user option requires a user id\n");
        } else {
            svc->uid = decode_uid(args[1]);
        }
        break;
    default:
        parse_error(state, "invalid option '%s'\n", args[0]);
    }
}